

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O0

void __thiscall
i2p::sam::Session::Session
          (Session *this,path *private_key_file,Proxy *control_host,CThreadInterrupt *interrupt)

{
  long lVar1;
  pointer in_RCX;
  Proxy *in_RDI;
  long in_FS_OFFSET;
  CService *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Proxy *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  fs::path::path((path *)in_stack_ffffffffffffff88,(path *)0x90ed26);
  Proxy::Proxy(this_01,in_RDI);
  in_RDI[1].m_unix_socket_path._M_dataplus._M_p = in_RCX;
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_ffffffffffffff88);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&in_RDI[2].proxy.super_CNetAddr.m_addr._union + 8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff88);
  std::unique_ptr<Sock,std::default_delete<Sock>>::unique_ptr<std::default_delete<Sock>,void>
            ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_ffffffffffffff88);
  CService::CService(in_stack_ffffffffffffff88);
  std::__cxx11::string::string(this_00);
  *(undefined1 *)&in_RDI[3].proxy.port = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Session::Session(const fs::path& private_key_file,
                 const Proxy& control_host,
                 CThreadInterrupt* interrupt)
    : m_private_key_file{private_key_file},
      m_control_host{control_host},
      m_interrupt{interrupt},
      m_transient{false}
{
}